

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O2

void __thiscall
QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
::reset(QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
        *this,ProgressData *other)

{
  ProgressData *ctx;
  
  ctx = this->d;
  if (ctx != other) {
    this->d = other;
    QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>::cleanup((EVP_PKEY_CTX *)ctx);
    return;
  }
  return;
}

Assistant:

void reset(T *other = nullptr) noexcept(noexcept(Cleanup::cleanup(std::declval<T *>())))
    {
        if (d == other)
            return;
        T *oldD = std::exchange(d, other);
        Cleanup::cleanup(oldD);
    }